

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O0

int gray_raster_render(QT_FT_Raster raster,QT_FT_Raster_Params *params)

{
  int *__src;
  int *__src_00;
  PWorker worker_00;
  undefined8 uVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  PWorker worker;
  QT_FT_Bitmap *target_map;
  QT_FT_Outline *outline;
  PWorker in_stack_00000040;
  int local_4;
  
  __src = (int *)in_RSI[1];
  __src_00 = (int *)*in_RSI;
  if (((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (in_RDI[1] == 0)) {
    local_4 = -3;
  }
  else {
    *(undefined4 *)(in_RDI[5] + 0x11e0) = *(undefined4 *)(in_RSI + 10);
    if (in_RDI[2] < 0x2000) {
      local_4 = -6;
    }
    else if (__src == (int *)0x0) {
      local_4 = -1;
    }
    else if ((__src[1] == 0) || (*__src < 1)) {
      local_4 = 0;
    }
    else if ((*(long *)(__src + 6) == 0) || (*(long *)(__src + 2) == 0)) {
      local_4 = -1;
    }
    else if (__src[1] == *(int *)(*(long *)(__src + 6) + (long)(*__src + -1) * 4) + 1) {
      worker_00 = (PWorker)in_RDI[5];
      if ((*(uint *)(in_RSI + 2) & 2) == 0) {
        if (__src_00 == (int *)0x0) {
          return -3;
        }
        if ((__src_00[1] == 0) || (*__src_00 == 0)) {
          return 0;
        }
        if (*(long *)(__src_00 + 4) == 0) {
          return -3;
        }
      }
      if ((*(uint *)(in_RSI + 2) & 1) == 0) {
        local_4 = -2;
      }
      else {
        if ((*(uint *)(in_RSI + 2) & 2) == 0) {
          (worker_00->clip_box).xMin = 0;
          (worker_00->clip_box).yMin = 0;
          (worker_00->clip_box).xMax = __src_00[1];
          (worker_00->clip_box).yMax = *__src_00;
        }
        else if ((*(uint *)(in_RSI + 2) & 4) == 0) {
          (worker_00->clip_box).xMin = -0x800000;
          (worker_00->clip_box).yMin = -0x800000;
          (worker_00->clip_box).xMax = 0x7fffff;
          (worker_00->clip_box).yMax = 0x7fffff;
        }
        else {
          uVar1 = in_RSI[8];
          (worker_00->clip_box).xMin = (int)uVar1;
          (worker_00->clip_box).yMin = (int)((ulong)uVar1 >> 0x20);
          uVar1 = in_RSI[9];
          (worker_00->clip_box).xMax = (int)uVar1;
          (worker_00->clip_box).yMax = (int)((ulong)uVar1 >> 0x20);
        }
        gray_init_cells(worker_00,(void *)*in_RDI,in_RDI[1]);
        memcpy(&worker_00->outline,__src,0x28);
        worker_00->num_cells = 0;
        worker_00->invalid = 1;
        worker_00->band_size = (int)in_RDI[3];
        if (__src_00 != (int *)0x0) {
          memcpy(&worker_00->target,__src_00,0x28);
        }
        worker_00->render_span = gray_render_span;
        worker_00->render_span_data = worker_00;
        if ((*(uint *)(in_RSI + 2) & 2) != 0) {
          worker_00->render_span = (QT_FT_SpanFunc)in_RSI[3];
          worker_00->render_span_data = (void *)in_RSI[7];
        }
        local_4 = gray_convert_glyph(in_stack_00000040);
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
  gray_raster_render( QT_FT_Raster                  raster,
                      const QT_FT_Raster_Params*  params )
  {
    const QT_FT_Outline*  outline    = (const QT_FT_Outline*)params->source;
    const QT_FT_Bitmap*   target_map = params->target;
    PWorker            worker;


    if ( !raster || !raster->buffer || !raster->buffer_size )
      return ErrRaster_Invalid_Argument;

    /* Should always be non-null, it is set by raster_reset() which is always */
    /* called with a non-null pool, and a pool_size >= MINIMUM_POOL_SIZE.     */
    assert(raster->worker);

    raster->worker->skip_spans = params->skip_spans;

    /* If raster object and raster buffer are allocated, but  */
    /* raster size isn't of the minimum size, indicate out of */
    /* memory.                                                */
    if (raster->buffer_allocated_size < MINIMUM_POOL_SIZE )
      return ErrRaster_OutOfMemory;

    if ( !outline )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    worker = raster->worker;

    /* if direct mode is not set, we must have a target bitmap */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      if ( !target_map )
        return ErrRaster_Invalid_Argument;

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return ErrRaster_Invalid_Argument;
    }

    /* this version does not support monochrome rendering */
    if ( !( params->flags & QT_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( ( params->flags & QT_FT_RASTER_FLAG_DIRECT ) == 0 )
    {
      /* compute clip box from target pixmap */
      ras.clip_box.xMin = 0;
      ras.clip_box.yMin = 0;
      ras.clip_box.xMax = target_map->width;
      ras.clip_box.yMax = target_map->rows;
    }
    else if ( params->flags & QT_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( worker, raster->buffer, raster->buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = raster->band_size;

    if ( target_map )
      ras.target = *target_map;

    ras.render_span      = (QT_FT_Raster_Span_Func)gray_render_span;
    ras.render_span_data = &ras;

    if ( params->flags & QT_FT_RASTER_FLAG_DIRECT )
    {
      ras.render_span      = (QT_FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }

    return gray_convert_glyph( worker );
  }